

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O2

void __thiscall options::options(options *this,uint argc,char **argv)

{
  string *this_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  this->prec = 0xf;
  local_50 = (string *)&this->Ja;
  std::__cxx11::string::string(local_50,"1",&local_59);
  this_00 = &this->Jb;
  std::__cxx11::string::string((string *)this_00,"1",&local_5a);
  local_58 = &this->Jc;
  std::__cxx11::string::string((string *)local_58,"1",&local_5b);
  (this->Tmin)._M_dataplus._M_p = (pointer)&(this->Tmin).field_2;
  (this->Tmin)._M_string_length = 0;
  (this->Tmin).field_2._M_local_buf[0] = '\0';
  (this->Tmax)._M_dataplus._M_p = (pointer)&(this->Tmax).field_2;
  (this->Tmax)._M_string_length = 0;
  (this->Tmax).field_2._M_local_buf[0] = '\0';
  (this->dT)._M_dataplus._M_p = (pointer)&(this->dT).field_2;
  (this->dT)._M_string_length = 0;
  (this->dT).field_2._M_local_buf[0] = '\0';
  this->valid = true;
  if (argc == 1) {
switchD_00107269_caseD_2:
    this->valid = false;
  }
  else {
    local_40 = (string *)&this->Tmin;
    local_48 = (string *)&this->Tmax;
    local_38 = &this->dT;
    iVar2 = 6;
    for (uVar3 = 1; uVar3 < argc; uVar3 = uVar3 + 2) {
      if (*argv[uVar3] != '-') {
        switch(~uVar3 + argc) {
        case 0:
          std::__cxx11::string::assign((char *)local_58);
          std::__cxx11::string::_M_assign((string *)this_00);
          std::__cxx11::string::_M_assign(local_50);
          break;
        case 1:
          std::__cxx11::string::assign((char *)local_58);
          std::__cxx11::string::_M_assign((string *)this_00);
          std::__cxx11::string::_M_assign(local_50);
          break;
        default:
          goto switchD_00107269_caseD_2;
        case 3:
          std::__cxx11::string::assign((char *)local_50);
          std::__cxx11::string::assign((char *)this_00);
          std::__cxx11::string::assign((char *)local_58);
          break;
        case 5:
          std::__cxx11::string::assign((char *)local_50);
          std::__cxx11::string::assign((char *)this_00);
          std::__cxx11::string::assign((char *)local_58);
          std::__cxx11::string::assign((char *)local_40);
          std::__cxx11::string::assign((char *)local_48);
          std::__cxx11::string::assign((char *)local_38);
          return;
        }
        std::__cxx11::string::assign((char *)local_38);
        std::__cxx11::string::_M_assign(local_48);
        std::__cxx11::string::_M_assign(local_40);
        return;
      }
      if ((argv[uVar3][1] != 'p') || (uVar3 + 1 == argc)) goto switchD_00107269_caseD_2;
      uVar1 = atoi(argv[iVar2 - 4]);
      this->prec = uVar1;
      iVar2 = iVar2 + 2;
    }
  }
  return;
}

Assistant:

options(unsigned int argc, char *argv[])
      : prec(15), Ja("1"), Jb("1"), Jc("1"), valid(true) {
    if (argc == 1) {
      valid = false;
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                valid = false;
                return;
              }
              prec = std::atoi(argv[i]);
              break;
            default:
              valid = false;
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Ja = Jb = Jc = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Ja = Jb = Jc = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 4:
              Ja = argv[i];
              Jb = argv[i + 1];
              Jc = argv[i + 2];
              Tmin = Tmax = dT = argv[i + 3];
              return;
            case 6:
              Ja = argv[i];
              Jb = argv[i + 1];
              Jc = argv[i + 2];
              Tmin = argv[i + 3];
              Tmax = argv[i + 4];
              dT = argv[i + 5];
              return;
            default:
              valid = false;
              return;
          }
      }
    }
  }